

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::editingFinished(QComboBoxPrivate *this)

{
  MatchFlags flags;
  bool bVar1;
  int iVar2;
  QCompleter *pQVar3;
  QCompleterPrivate *pQVar4;
  QItemSelectionModel *pQVar5;
  QComboBoxPrivate *this_00;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int index;
  bool completerIsActive;
  QItemSelectionModel *selModel;
  QAbstractItemView *popup;
  QCompleter *leCompleter;
  QComboBox *q;
  QModelIndex curIndex;
  QString leText;
  QModelIndex *in_stack_fffffffffffffef8;
  QListSpecialMethodsBase<QModelIndex> *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  QComboBoxPrivate *this_01;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  byte bVar6;
  byte bVar7;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar8;
  undefined1 in_stack_ffffffffffffff37;
  QPersistentModelIndex local_98 [6];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QPersistentModelIndex local_50 [6];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->lineEdit == (QLineEdit *)0x0) goto LAB_00536ebc;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QLineEdit *)
                  CONCAT17(in_stack_ffffffffffffff0f,
                           CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
  bVar1 = QString::isEmpty((QString *)0x536c6f);
  bVar6 = 0;
  bVar7 = bVar6;
  if (!bVar1) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
    itemText((QComboBoxPrivate *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
             (QModelIndex *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar6 = ::operator!=((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
    bVar7 = bVar6;
    QString::~QString((QString *)0x536cf0);
  }
  if ((bVar6 & 1) != 0) {
    pQVar3 = QLineEdit::completer((QLineEdit *)in_stack_ffffffffffffff00);
    if (pQVar3 == (QCompleter *)0x0) {
      this_01 = (QComboBoxPrivate *)0x0;
    }
    else {
      pQVar4 = QCompleterPrivate::get((QCompleter *)0x536d25);
      this_01 = (QComboBoxPrivate *)pQVar4->popup;
    }
    if ((this_01 != (QComboBoxPrivate *)0x0) &&
       (bVar1 = QWidget::isVisible((QWidget *)0x536d5c), bVar1)) {
      pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff00);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::currentIndex((QAbstractItemView *)this_01);
      bVar8 = 0;
      in_stack_ffffffffffffff0e = false;
      if (pQVar5 != (QItemSelectionModel *)0x0) {
        QItemSelectionModel::selectedIndexes();
        bVar8 = 1;
        in_stack_ffffffffffffff0e =
             QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      in_stack_ffffffffffffff0f = in_stack_ffffffffffffff0e;
      if ((bVar8 & 1) != 0) {
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x536e17);
      }
      if ((in_stack_ffffffffffffff0e & 1) != 0) goto LAB_00536eaf;
    }
    this_00 = (QComboBoxPrivate *)q_func(in_RDI);
    matchFlags(this_00);
    flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i._2_1_ =
         bVar6;
    flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i._0_2_ =
         in_stack_ffffffffffffff1c;
    flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i._3_1_ =
         bVar7;
    iVar2 = QComboBox::findText((QComboBox *)this_01,
                                (QString *)
                                CONCAT17(in_stack_ffffffffffffff0f,
                                         CONCAT16(in_stack_ffffffffffffff0e,
                                                  in_stack_ffffffffffffff08)),flags);
    if (iVar2 != -1) {
      QComboBox::setCurrentIndex
                ((QComboBox *)
                 CONCAT17(bVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff1c,
                                                        in_stack_ffffffffffffff18))),
                 (int)((ulong)this_01 >> 0x20));
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_98);
      emitActivated(this_01,(QModelIndex *)
                            CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)))
      ;
    }
  }
LAB_00536eaf:
  QString::~QString((QString *)0x536ebc);
LAB_00536ebc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::editingFinished()
{
    Q_Q(QComboBox);
    if (!lineEdit)
        return;
    const auto leText = lineEdit->text();
    if (!leText.isEmpty() && itemText(currentIndex) != leText) {
#if QT_CONFIG(completer)
        const auto *leCompleter = lineEdit->completer();
        const auto *popup = leCompleter ? QCompleterPrivate::get(leCompleter)->popup : nullptr;
        if (popup && popup->isVisible()) {
            // QLineEdit::editingFinished() will be emitted before the code flow returns
            // to QCompleter::eventFilter(), where QCompleter::activated() may be emitted.
            // We know that the completer popup will still be visible at this point, and
            // that any selection should be valid.
            const QItemSelectionModel *selModel = popup->selectionModel();
            const QModelIndex curIndex = popup->currentIndex();
            const bool completerIsActive = selModel && selModel->selectedIndexes().contains(curIndex);

            if (completerIsActive)
                return;
        }
#endif
        const int index = q_func()->findText(leText, matchFlags());
        if (index != -1) {
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }

}